

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case0050(ParserTester *this)

{
  string text;
  Expectation X;
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  undefined1 in_stack_fffffffffffffe18 [64];
  undefined8 in_stack_fffffffffffffe58;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 in_stack_fffffffffffffe60;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined1 in_stack_fffffffffffffe84 [76];
  ParseOptions in_stack_fffffffffffffed0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe38,"double _Complex int x ;",
             (allocator<char> *)&stack0xfffffffffffffe1f);
  Expectation::Expectation((Expectation *)&stack0xfffffffffffffe88);
  uVar2 = 0x401040103ee03e8;
  uVar3 = 0x4120401;
  __l._M_len = 6;
  __l._M_array = (iterator)&stack0xfffffffffffffe78;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffe20,__l,(allocator_type *)&stack0xfffffffffffffe1e);
  pEVar1 = Expectation::AST((Expectation *)&stack0xfffffffffffffe88,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &stack0xfffffffffffffe20);
  Expectation::Expectation(&local_c0,pEVar1);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xfffffffffffffe58);
  text._M_string_length = in_stack_fffffffffffffe60.BF_all_;
  text._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
  text.field_2._M_allocated_capacity = in_stack_fffffffffffffe68.BF_all_;
  text.field_2._8_8_ = in_stack_fffffffffffffe70;
  X.ambiguityText_._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
  X.numE_ = in_stack_fffffffffffffe18._0_4_;
  X.numW_ = in_stack_fffffffffffffe18._4_4_;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffe18._8_24_;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffe18._32_24_;
  X.continueTestDespiteOfErrors_ = (bool)in_stack_fffffffffffffe18[0x38];
  X.containsAmbiguity_ = (bool)in_stack_fffffffffffffe18[0x39];
  X._58_6_ = in_stack_fffffffffffffe18._58_6_;
  X.ambiguityText_._M_string_length = in_stack_fffffffffffffe60.BF_all_;
  X.ambiguityText_.field_2._M_allocated_capacity = in_stack_fffffffffffffe68.BF_all_;
  X.ambiguityText_.field_2._8_8_ = in_stack_fffffffffffffe70;
  X._96_8_ = uVar2;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_start._0_4_ = uVar3;
  X._108_76_ = in_stack_fffffffffffffe84;
  parse(this,text,X,(SyntaxCategory)&stack0xfffffffffffffe38,in_stack_fffffffffffffed0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            ((_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffe20);
  Expectation::~Expectation((Expectation *)&stack0xfffffffffffffe88);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
  return;
}

Assistant:

void ParserTester::case0050()
{
    // Not a syntactic error, but a semantic one; covered in:
    CROSS_REFERENCE_TEST(DeclarationBinderTester::case0016);

    parse("double _Complex int x ;",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::VariableAndOrFunctionDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::IdentifierDeclarator }));
}